

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nni_sha1_final(nni_sha1_ctx *ctx,uint8_t *digest)

{
  int local_1c;
  int i;
  uint8_t *digest_local;
  nni_sha1_ctx *ctx_local;
  
  nni_sha1_pad(ctx);
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    digest[local_1c << 2] = (uint8_t)(ctx->digest[local_1c] >> 0x18);
    digest[local_1c * 4 + 1] = (uint8_t)(ctx->digest[local_1c] >> 0x10);
    digest[local_1c * 4 + 2] = (uint8_t)(ctx->digest[local_1c] >> 8);
    digest[local_1c * 4 + 3] = (uint8_t)ctx->digest[local_1c];
  }
  return;
}

Assistant:

void
nni_sha1_final(nni_sha1_ctx *ctx, uint8_t digest[20])
{
	nni_sha1_pad(ctx);
	for (int i = 0; i < 5; i++) {
		digest[i * 4]     = (ctx->digest[i] >> 24) & 0xff;
		digest[i * 4 + 1] = (ctx->digest[i] >> 16) & 0xff;
		digest[i * 4 + 2] = (ctx->digest[i] >> 8) & 0xff;
		digest[i * 4 + 3] = (ctx->digest[i] >> 0) & 0xff;
	}
}